

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O0

void __thiscall Scs::Address::Address(Address *this,String *port,bool passive)

{
  uint uVar1;
  char *__service;
  undefined1 local_50 [4];
  int result;
  addrinfo hints;
  bool passive_local;
  String *port_local;
  Address *this_local;
  
  this->m_address = (addrinfo *)0x0;
  hints.ai_next._7_1_ = passive;
  memset(local_50,0,0x30);
  result = 2;
  hints.ai_flags = 1;
  if ((hints.ai_next._7_1_ & 1) != 0) {
    local_50 = (undefined1  [4])0x1;
  }
  __service = std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::c_str
                        (port);
  uVar1 = getaddrinfo((char *)0x0,__service,(addrinfo *)local_50,(addrinfo **)this);
  if (uVar1 != 0) {
    LogWriteLine("getaddrinfo failed: %d",(ulong)uVar1);
  }
  this->m_current = this->m_address;
  Log(this);
  return;
}

Assistant:

Address::Address(const String & port, bool passive)
{
	// Server setup

	// Set up structures
	m_address = NULL;
	addrinfo hints;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // Note: Windows fails to connect if left unspecified
	hints.ai_socktype = SOCK_STREAM;
	//hints.ai_protocol = IPPROTO_TCP;
	if (passive)
		hints.ai_flags = AI_PASSIVE;

	// Resolve the port to be used by the socket
	int result = getaddrinfo(nullptr, port.c_str(), &hints, &m_address);
	if (result != 0)
	{
		LogWriteLine("getaddrinfo failed: %d", result);
	}
	m_current = m_address;
	Log();
}